

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall
Graph<std::pair<double,_double>_>::dfsVisit
          (Graph<std::pair<double,_double>_> *this,Vertex<std::pair<double,_double>_> *v,
          vector<int,_std::allocator<int>_> *res)

{
  pointer ppEVar1;
  _Vector_base<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
  local_38;
  
  v->visited = true;
  local_38._M_impl.super__Vector_impl_data._M_start._0_4_ = v->id;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(res,(int *)&local_38);
  std::
  vector<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>::
  vector((vector<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
          *)&local_38,&v->outgoing);
  for (ppEVar1 = (pointer)CONCAT44(local_38._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (int)local_38._M_impl.super__Vector_impl_data._M_start);
      ppEVar1 != local_38._M_impl.super__Vector_impl_data._M_finish; ppEVar1 = ppEVar1 + 1) {
    if ((*ppEVar1)->dest->visited == false) {
      dfsVisit(this,(*ppEVar1)->dest,res);
    }
  }
  std::
  _Vector_base<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
  ::~_Vector_base(&local_38);
  return;
}

Assistant:

void Graph<T>::dfsVisit(Vertex<T> *v, vector<int> &res) const {
    v->visited = true;
    res.push_back(v->getId());
    for (auto edge : v->getAdj()) {
        if (!edge->dest->visited) { dfsVisit(edge->dest, res); }
    }
}